

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O0

bool common_params_parse(int argc,char **argv,common_params *params,llama_example ex,
                        _func_void_int_char_ptr_ptr *print_usage)

{
  undefined1 uVar1;
  undefined8 in_RSI;
  undefined4 in_EDI;
  invalid_argument *ex_1;
  common_params params_org;
  common_params_context ctx_arg;
  _func_void_int_char_ptr_ptr *in_stack_0001bc08;
  llama_example in_stack_0001bc14;
  common_params *in_stack_0001bc18;
  common_params *in_stack_ffffffffffffec38;
  undefined7 in_stack_ffffffffffffec40;
  common_params_context *in_stack_ffffffffffffecd0;
  common_params *in_stack_ffffffffffffed88;
  common_params *in_stack_ffffffffffffed90;
  common_params_context *in_stack_fffffffffffff530;
  common_params_context *in_stack_fffffffffffff590;
  char **in_stack_fffffffffffff598;
  int in_stack_fffffffffffff5a4;
  undefined8 local_50;
  undefined8 local_30;
  undefined1 local_1;
  
  common_params_parser_init(in_stack_0001bc18,in_stack_0001bc14,in_stack_0001bc08);
  common_params::common_params(in_stack_ffffffffffffed90,in_stack_ffffffffffffed88);
  uVar1 = common_params_parse_ex
                    (in_stack_fffffffffffff5a4,in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  if ((bool)uVar1) {
    if ((*(byte *)(local_50 + 0x1019) & 1) != 0) {
      common_params_print_usage(in_stack_ffffffffffffecd0);
      if (local_30 != (code *)0x0) {
        (*local_30)(in_EDI,in_RSI);
      }
      exit(0);
    }
    if ((*(byte *)(local_50 + 0x101a) & 1) != 0) {
      common_params_print_completion(in_stack_fffffffffffff530);
      exit(0);
    }
    local_1 = true;
  }
  else {
    common_params::operator=
              ((common_params *)CONCAT17(uVar1,in_stack_ffffffffffffec40),in_stack_ffffffffffffec38)
    ;
    local_1 = false;
  }
  common_params::~common_params((common_params *)CONCAT17(uVar1,in_stack_ffffffffffffec40));
  common_params_context::~common_params_context((common_params_context *)0x181c16);
  return local_1;
}

Assistant:

bool common_params_parse(int argc, char ** argv, common_params & params, llama_example ex, void(*print_usage)(int, char **)) {
    auto ctx_arg = common_params_parser_init(params, ex, print_usage);
    const common_params params_org = ctx_arg.params; // the example can modify the default params

    try {
        if (!common_params_parse_ex(argc, argv, ctx_arg)) {
            ctx_arg.params = params_org;
            return false;
        }
        if (ctx_arg.params.usage) {
            common_params_print_usage(ctx_arg);
            if (ctx_arg.print_usage) {
                ctx_arg.print_usage(argc, argv);
            }
            exit(0);
        }
        if (ctx_arg.params.completion) {
            common_params_print_completion(ctx_arg);
            exit(0);
        }
    } catch (const std::invalid_argument & ex) {
        fprintf(stderr, "%s\n", ex.what());
        ctx_arg.params = params_org;
        return false;
    }

    return true;
}